

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot_persistence_heat_map.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined1 local_b0 [8];
  Persistence_heat_maps l;
  char **argv_local;
  int argc_local;
  
  l.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "This program creates a gnuplot script from a persistence heat maps stored in a file (the file needs "
                          );
  std::operator<<(poVar1,
                  "to be created beforehand). Please call the code with the name of a single heat maps file \n"
                 );
  if (argc == 2) {
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
    Persistence_heat_maps
              ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                *)local_b0);
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
    load_from_file((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                    *)local_b0,
                   (char *)((l.heat_map.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_finish);
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::plot
              ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                *)local_b0,
               (char *)((l.heat_map.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
    ~Persistence_heat_maps
              ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                *)local_b0);
  }
  else {
    std::operator<<((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n")
    ;
  }
  argv_local._4_4_ = (uint)(argc != 2);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates a gnuplot script from a persistence heat maps stored in a file (the file needs "
            << "to be created beforehand). Please call the code with the name of a single heat maps file \n";
  if (argc != 2) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }
  Persistence_heat_maps l;
  l.load_from_file(argv[1]);
  l.plot(argv[1]);
  return 0;
}